

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int BIO_s_custom_write(BIO *bio,char *data,int length)

{
  us_socket_t *s;
  int in_EDX;
  BIO *in_RDI;
  int written;
  loop_ssl_data *loop_ssl_data;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  s = (us_socket_t *)BIO_get_data(in_RDI);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffd0);
  if (*(int *)((long)&s->next + 4) == 0) {
    uVar1 = CONCAT13(in_EDX == 0x401d,(int3)in_stack_ffffffffffffffd0);
  }
  *(uint *)&s->next = uVar1 >> 0x18;
  local_4 = us_socket_write(in_stack_ffffffffffffffe0,s,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),
                            in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    BIO_set_flags(in_RDI,10);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int BIO_s_custom_write(BIO *bio, const char *data, int length) {
    struct loop_ssl_data *loop_ssl_data = (struct loop_ssl_data *) BIO_get_data(bio);

    //printf("BIO_s_custom_write\n");

    loop_ssl_data->last_write_was_msg_more = loop_ssl_data->msg_more || length == 16413;
    int written = us_socket_write(0, loop_ssl_data->ssl_socket, data, length, loop_ssl_data->last_write_was_msg_more);

    if (!written) {
        BIO_set_flags(bio, BIO_FLAGS_SHOULD_RETRY | BIO_FLAGS_WRITE);
        return -1;
    }

    //printf("BIO_s_custom_write returns: %d\n", ret);

    return written;
}